

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleQueue.hpp
# Opt level: O0

size_t __thiscall
gmlc::containers::
SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>::
size(SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
     *this)

{
  size_type sVar1;
  size_type sVar2;
  long in_RDI;
  lock_guard<std::mutex> pushLock;
  lock_guard<std::mutex> pullLock;
  mutex_type *in_stack_ffffffffffffffb8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffc0;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  sVar1 = std::
          vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
          ::size((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                  *)(in_RDI + 0x68));
  sVar2 = std::
          vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
          ::size((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                  *)(in_RDI + 0x50));
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2787bd);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2787c7);
  return sVar1 + sVar2;
}

Assistant:

size_t size() const
        {
            std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
            std::lock_guard<MUTEX> pushLock(m_pushLock);  // second pushLock
            return pullElements.size() + pushElements.size();
        }